

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ech_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  size_t sVar2;
  uint8_t local_29;
  CBS *pCStack_28;
  uint8_t type;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (contents == (CBS *)0x0) {
    hs_local._7_1_ = true;
  }
  else {
    pCStack_28 = contents;
    contents_local = (CBS *)out_alert;
    out_alert_local = (uint8_t *)hs;
    iVar1 = CBS_get_u8(contents,&local_29);
    if (iVar1 == 0) {
      hs_local._7_1_ = false;
    }
    else if (local_29 == '\0') {
      hs_local._7_1_ = true;
    }
    else {
      if ((local_29 == '\x01') && (sVar2 = CBS_len(pCStack_28), sVar2 == 0)) {
        *(uint *)(out_alert_local + 0x6c8) = *(uint *)(out_alert_local + 0x6c8) & 0xfffffffe | 1;
        return true;
      }
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ech_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  if (contents == nullptr) {
    return true;
  }

  uint8_t type;
  if (!CBS_get_u8(contents, &type)) {
    return false;
  }
  if (type == ECH_CLIENT_OUTER) {
    // Outer ECH extensions are handled outside the callback.
    return true;
  }
  if (type != ECH_CLIENT_INNER || CBS_len(contents) != 0) {
    return false;
  }

  hs->ech_is_inner = true;
  return true;
}